

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.c
# Opt level: O1

_Bool queue_init(queue_t *queue)

{
  if (queue != (queue_t *)0x0) {
    queue->head = (qnode_t *)0x0;
    queue->tail = (qnode_t *)0x0;
    *(undefined8 *)&queue->len = 0;
  }
  return queue != (queue_t *)0x0;
}

Assistant:

bool queue_init(queue_t *queue)
{
    bool status = false;

    if (queue == NULL) {
        goto EXIT;
    }

    bzero(queue, sizeof(queue_t));
    status = true;

EXIT:
    return status;
}